

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void number_suite::value_int64(void)

{
  bool bVar1;
  value vVar2;
  size_type sVar3;
  float fVar4;
  reader reader;
  value_type input [9];
  ulong local_c8;
  double local_c0 [4];
  reader local_a0;
  uchar local_28 [16];
  
  local_28[0] = 0xd6;
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\x01';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[9]>(&local_a0,(uchar (*) [9])local_28);
  local_c8._0_4_ = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23b,"void number_suite::value_int64()",local_c0,&local_c8);
  local_c0[0]._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(local_a0.decoder.current.code);
  local_c8._0_4_ = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23c,"void number_suite::value_int64()",local_c0,&local_c8);
  vVar2 = trial::protocol::bintoken::detail::decoder::category(&local_a0.decoder);
  local_c0[0] = (double)CONCAT44(local_c0[0]._4_4_,vVar2);
  local_c8 = CONCAT44(local_c8._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23d,"void number_suite::value_int64()",local_c0,&local_c8);
  sVar3 = trial::protocol::bintoken::reader::length(&local_a0);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23e,"void number_suite::value_int64()",sVar3 == 1);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::boolean,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x241,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int8,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x243,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int16,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x245,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int32,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x247,"void number_suite::value_int64()");
  local_c0[0] = (double)trial::protocol::bintoken::reader::
                        overloader<trial::protocol::bintoken::token::int64,_void>::convert
                                  (&local_a0);
  local_c8 = 0x100000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64>()","UINT64_C(0x100000000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x248,"void number_suite::value_int64()",local_c0,&local_c8);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float32,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24a,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float64,_void>::
  convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24c,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<signed_char,_void>::convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24f,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<short,_void>::convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<std::int16_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x251,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::overloader<int,_void>::convert(&local_a0);
  boost::detail::throw_failed_impl
            ("reader.value<std::int32_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x253,"void number_suite::value_int64()");
  local_c0[0] = (double)trial::protocol::bintoken::reader::overloader<long,_void>::convert
                                  (&local_a0);
  local_c8 = 0x100000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x100000000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x254,"void number_suite::value_int64()",local_c0,&local_c8);
  fVar4 = trial::protocol::bintoken::reader::overloader<float,_void>::convert(&local_a0);
  local_c0[0] = (double)CONCAT44(local_c0[0]._4_4_,fVar4);
  local_c8 = CONCAT44(local_c8._4_4_,0x4f800000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","4294967296.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x255,"void number_suite::value_int64()",local_c0,&local_c8);
  local_c0[0] = trial::protocol::bintoken::reader::overloader<double,_void>::convert(&local_a0);
  local_c8 = 0x41f0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","4294967296.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x256,"void number_suite::value_int64()",local_c0,&local_c8);
  bVar1 = trial::protocol::bintoken::reader::next(&local_a0);
  local_c0[0] = (double)CONCAT71(local_c0[0]._1_7_,bVar1);
  local_c8 = local_c8 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,599,"void number_suite::value_int64()",local_c0,&local_c8);
  local_c0[0] = (double)CONCAT44(local_c0[0]._4_4_,local_a0.decoder.current.code);
  local_c8 = local_c8 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,600,"void number_suite::value_int64()",local_c0,&local_c8);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_a0.stack);
  return;
}

Assistant:

void value_int64()
{
    const value_type input[] = { token::code::int64, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int64);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64>(), UINT64_C(0x100000000));
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int16_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int32_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x100000000));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 4294967296.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 4294967296.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}